

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O1

uint8_t * bstr_match_pair(uint8_t *pBegin,uint8_t *pEnd,uint8_t left,uint8_t right,
                         uint8_t escapeChar)

{
  uint8_t uVar1;
  uint8_t *in_RAX;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  bool bVar5;
  
  if (pBegin < pEnd) {
    if (*pBegin != left) {
      return (uint8_t *)0x0;
    }
    puVar3 = pBegin + 1;
    if (escapeChar == '\0') {
      iVar4 = 0;
      while (puVar3 < pEnd) {
        if (*puVar3 == right) {
          uVar2 = 0xffffffff;
          if (iVar4 != 0) goto LAB_0013a8be;
          iVar4 = 0;
          bVar5 = false;
          in_RAX = puVar3;
        }
        else {
          uVar2 = (uint)(*puVar3 == left);
LAB_0013a8be:
          iVar4 = iVar4 + uVar2;
          puVar3 = puVar3 + 1;
          bVar5 = true;
        }
        if (!bVar5) {
          return in_RAX;
        }
      }
    }
    else {
      if (puVar3 < pEnd) {
        bVar5 = false;
        iVar4 = 0;
        do {
          if (bVar5) {
            puVar3 = puVar3 + 1;
            uVar2 = 2;
            bVar5 = false;
          }
          else {
            uVar1 = *puVar3;
            if (uVar1 == escapeChar) {
              bVar5 = true;
            }
            else if (uVar1 == right) {
              if (iVar4 == 0) {
                uVar2 = 1;
                iVar4 = 0;
                in_RAX = puVar3;
                goto LAB_0013a871;
              }
              iVar4 = iVar4 + -1;
            }
            else {
              iVar4 = iVar4 + (uint)(uVar1 == left);
            }
            puVar3 = puVar3 + 1;
            uVar2 = 0;
          }
LAB_0013a871:
          if ((uVar2 & 1) != 0) goto LAB_0013a8d4;
        } while (puVar3 < pEnd);
        uVar2 = 0;
LAB_0013a8d4:
        bVar5 = uVar2 == 0;
      }
      else {
        bVar5 = true;
      }
      if (!bVar5) {
        return in_RAX;
      }
    }
  }
  return pBegin;
}

Assistant:

const uint8_t *bstr_match_pair(const uint8_t *pBegin, const uint8_t *pEnd, uint8_t left, uint8_t right, uint8_t escapeChar){
   const uint8_t *pNext = pBegin;
   uint32_t innerLevelCount=0;
   if (pNext < pEnd){
      if (*pNext == left){
         pNext++;
         if (escapeChar != 0){
            uint8_t isEscape = 0;
            while (pNext < pEnd){
               uint8_t c = *pNext;
               if (isEscape != 0){
                  //ignore this char
                  pNext++;
                  isEscape = 0;
                  continue;
               }
               else {
                  if ( c == escapeChar ){
                     isEscape = 1;
                  }
                  else if (c == right){
                     if (innerLevelCount == 0) {
                        return pNext;
                     }
                     else {
                        innerLevelCount--;
                     }
                  }
                  else if ( c == left )
                  {
                     innerLevelCount++;
                  }
               }
               pNext++;
            }
         }
         else{
            while (pNext < pEnd) {
               uint8_t c = *pNext;
               if (c == right){
                  if (innerLevelCount == 0) {
                     return pNext;
                  }
                  else {
                     innerLevelCount--;
                  }
               }
               else if (c == left)
               {
                  innerLevelCount++;
               }
               pNext++;
            }
         }
      }
      else
      {
         return 0; //string does not start with \par left character
      }
   }
   return pBegin;
}